

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O1

void fd_tcp_socket(int *fds)

{
  int __fd;
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  void *client_socket;
  pthread_t client_thread;
  void *local_28;
  pthread_t local_20;
  
  __fd = create_bound_socket();
  iVar1 = listen(__fd,5);
  if (iVar1 == 0) {
    iVar1 = pthread_create(&local_20,(pthread_attr_t *)0x0,connector_client,(void *)0x0);
    if (iVar1 == 0) {
      iVar1 = accept4(__fd,(sockaddr *)0x0,(socklen_t *)0x0,0x80000);
      if (iVar1 < 0) {
        pcVar3 = "conn >= 0";
        uVar4 = 0x8b;
      }
      else {
        local_28 = (void *)0x0;
        iVar2 = pthread_join(local_20,&local_28);
        if (iVar2 == 0) {
          *fds = iVar1;
          fds[1] = (int)local_28;
          fds[2] = __fd;
          return;
        }
        pcVar3 = "pthread_join(client_thread, &client_socket) == 0";
        uVar4 = 0x8f;
      }
    }
    else {
      pcVar3 = "pthread_create(&client_thread, NULL, connector_client, NULL) == 0";
      uVar4 = 0x84;
    }
  }
  else {
    pcVar3 = "listen(sock, 5) == 0";
    uVar4 = 0x80;
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar4,pcVar3);
}

Assistant:

static void
fd_tcp_socket(int fds[3])
{
	int sock = create_bound_socket();

	ATF_REQUIRE(listen(sock, 5) == 0);

	pthread_t client_thread;
	ATF_REQUIRE(
	    pthread_create(&client_thread, NULL, connector_client, NULL) == 0);

#ifdef __APPLE__
	int conn = accept(sock, NULL, NULL);
#else
	int conn = accept4(sock, NULL, NULL, SOCK_CLOEXEC);
#endif
	ATF_REQUIRE(conn >= 0);

	void *client_socket = NULL;

	ATF_REQUIRE(pthread_join(client_thread, &client_socket) == 0);

	fds[0] = conn;
	fds[1] = (int)(intptr_t)client_socket;
	fds[2] = sock;
}